

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  ulong uVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *this_04;
  ServiceGenerator *this_05;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *this_06;
  ExtensionGenerator *this_07;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  this->file_ = file;
  lVar6 = (long)*(int *)(file + 0x48);
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (lVar6 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->message_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(file + 0x58);
  lVar6 = (long)iVar2;
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->enum_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(file + 0x68);
  lVar6 = (long)iVar2;
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->service_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(file + 0x78);
  lVar6 = (long)iVar2;
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar4 + 1);
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar3 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options_,pcVar3,pcVar3 + (options->dllexport_decl)._M_string_length);
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  if (0 < *(int *)(file + 0x48)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      this_00 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
                ::operator[](&this->message_generators_,lVar7);
      this_01 = (MessageGenerator *)operator_new(0x78);
      MessageGenerator::MessageGenerator
                (this_01,(Descriptor *)(*(long *)(file + 0x50) + lVar6),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset
                (this_00,this_01);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar7 < *(int *)(file + 0x48));
  }
  if (0 < *(int *)(file + 0x58)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      this_02 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
                ::operator[](&this->enum_generators_,lVar7);
      this_03 = (EnumGenerator *)operator_new(0x50);
      EnumGenerator::EnumGenerator
                (this_03,(EnumDescriptor *)(*(long *)(file + 0x60) + lVar6),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(this_02,this_03);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x38;
    } while (lVar7 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      this_04 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator[](&this->service_generators_,lVar7);
      this_05 = (ServiceGenerator *)operator_new(0x38);
      ServiceGenerator::ServiceGenerator
                (this_05,(ServiceDescriptor *)(*(long *)(file + 0x70) + lVar6),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::reset
                (this_04,this_05);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x30;
    } while (lVar7 < *(int *)(file + 0x68));
  }
  if (0 < *(int *)(file + 0x78)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      this_06 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_,lVar7);
      this_07 = (ExtensionGenerator *)operator_new(0x50);
      ExtensionGenerator::ExtensionGenerator
                (this_07,(FieldDescriptor *)(*(long *)(file + 0x80) + lVar6),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset
                (this_06,this_07);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar7 < *(int *)(file + 0x78));
  }
  google::protobuf::SplitStringUsing
            (*(string **)(this->file_ + 8),".",(vector *)&this->package_parts_);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file,
                             const Options& options)
  : file_(file),
    message_generators_(
      new scoped_ptr<MessageGenerator>[file->message_type_count()]),
    enum_generators_(
      new scoped_ptr<EnumGenerator>[file->enum_type_count()]),
    service_generators_(
      new scoped_ptr<ServiceGenerator>[file->service_count()]),
    extension_generators_(
      new scoped_ptr<ExtensionGenerator>[file->extension_count()]),
    options_(options) {

  for (int i = 0; i < file->message_type_count(); i++) {
    message_generators_[i].reset(
      new MessageGenerator(file->message_type(i), options));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_[i].reset(
      new EnumGenerator(file->enum_type(i), options));
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_[i].reset(
      new ServiceGenerator(file->service(i), options));
  }

  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_[i].reset(
      new ExtensionGenerator(file->extension(i), options));
  }

  SplitStringUsing(file_->package(), ".", &package_parts_);
}